

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeGenerator.cpp
# Opt level: O1

EmitExpressionInfo __thiscall
Js::AsmJSByteCodeGenerator::EmitBooleanExpression
          (AsmJSByteCodeGenerator *this,ParseNode *expr,ByteCodeLabel trueLabel,
          ByteCodeLabel falseLabel)

{
  bool bVar1;
  ParseNodeUni *pPVar2;
  AsmJsCompilationException *this_00;
  ByteCodeLabel labelID;
  EmitExpressionInfo local_28;
  
  while (labelID = falseLabel, expr->nop == knopLogNot) {
    pPVar2 = ParseNode::AsParseNodeUni(expr);
    falseLabel = trueLabel;
    trueLabel = labelID;
    expr = pPVar2->pnode1;
  }
  local_28 = Emit(this,expr);
  bVar1 = AsmJsType::isInt(&local_28.type);
  if (bVar1) {
    AsmJsByteCodeWriter::AsmBrReg1
              (&this->mWriter,BrTrue_Int,trueLabel,local_28.super_EmitInfoBase.location);
    AsmJsByteCodeWriter::AsmBr(&this->mWriter,labelID,AsmBr);
    return local_28;
  }
  this_00 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
  AsmJsCompilationException::AsmJsCompilationException
            (this_00,L"Comparison expressions must be type signed");
  __cxa_throw(this_00,&AsmJsCompilationException::typeinfo,0);
}

Assistant:

EmitExpressionInfo AsmJSByteCodeGenerator::EmitBooleanExpression( ParseNode* expr, Js::ByteCodeLabel trueLabel, Js::ByteCodeLabel falseLabel )
    {
        switch( expr->nop )
        {
        case knopLogNot:{
            const EmitExpressionInfo& info = EmitBooleanExpression( expr->AsParseNodeUni()->pnode1, falseLabel, trueLabel );
            return info;
            break;
        }
//         case knopEq:
//         case knopNe:
//         case knopLt:
//         case knopLe:
//         case knopGe:
//         case knopGt:
//             byteCodeGenerator->StartStatement( expr );
//             EmitBinaryOpnds( expr->AsParseNodeBin()->pnode1, expr->AsParseNodeBin()->pnode2, byteCodeGenerator, funcInfo );
//             funcInfo->ReleaseLoc( expr->AsParseNodeBin()->pnode2 );
//             funcInfo->ReleaseLoc( expr->AsParseNodeBin()->pnode1 );
//             mWriter.BrReg2( nopToOp[expr->nop], trueLabel, expr->AsParseNodeBin()->pnode1->location,
//                                                  expr->AsParseNodeBin()->pnode2->location );
//             mWriter.AsmBr( falseLabel );
//             byteCodeGenerator->EndStatement( expr );
//             break;
//         case knopName:
//             byteCodeGenerator->StartStatement( expr );
//             Emit( expr, byteCodeGenerator, funcInfo, false );
//             mWriter.BrReg1( Js::OpCode::BrTrue_A, trueLabel, expr->location );
//             mWriter.AsmBr( falseLabel );
//             byteCodeGenerator->EndStatement( expr );
//             break;
        default:{
            const EmitExpressionInfo& info = Emit( expr );
            if( !info.type.isInt() )
            {
                throw AsmJsCompilationException( _u("Comparison expressions must be type signed") );
            }
            mWriter.AsmBrReg1( Js::OpCodeAsmJs::BrTrue_Int, trueLabel, info.location );
            mWriter.AsmBr( falseLabel );
            return info;
            break;
            }
        }
    }